

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
          *fadexpr)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_> *pFVar4;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *pFVar5;
  Fad<double> *pFVar6;
  double *pdVar7;
  Fad<double> *pFVar8;
  double *pdVar9;
  Fad<double> *pFVar10;
  double *pdVar11;
  double *pdVar12;
  ulong uVar13;
  value_type vVar14;
  
  pFVar4 = (fadexpr->fadexpr_).left_;
  pFVar5 = (pFVar4->fadexpr_).left_;
  uVar2 = (((pFVar5->fadexpr_).left_)->dx_).num_elts;
  uVar3 = (((pFVar5->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar3 < (int)uVar2) {
    uVar3 = uVar2;
  }
  uVar2 = (((pFVar4->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar3 <= (int)uVar2) {
    uVar3 = uVar2;
  }
  uVar2 = (this->dx_).num_elts;
  if (uVar3 != uVar2) {
    if (uVar3 == 0) {
      if (uVar2 != 0) {
        pdVar12 = (this->dx_).ptr_to_data;
        if (pdVar12 != (double *)0x0) {
          operator_delete__(pdVar12);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
    }
    else {
      if (uVar2 != 0) {
        pdVar12 = (this->dx_).ptr_to_data;
        if (pdVar12 != (double *)0x0) {
          operator_delete__(pdVar12);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      (this->dx_).num_elts = uVar3;
      uVar13 = 0xffffffffffffffff;
      if (-1 < (int)uVar3) {
        uVar13 = (long)(int)uVar3 << 3;
      }
      pdVar12 = (double *)operator_new__(uVar13);
      (this->dx_).ptr_to_data = pdVar12;
    }
  }
  if (uVar3 != 0) {
    pdVar12 = (this->dx_).ptr_to_data;
    pFVar4 = (fadexpr->fadexpr_).left_;
    pFVar5 = (pFVar4->fadexpr_).left_;
    pFVar6 = (pFVar5->fadexpr_).left_;
    if ((((pFVar6->dx_).num_elts == 0) || ((((pFVar5->fadexpr_).right_)->dx_).num_elts == 0)) ||
       ((((pFVar4->fadexpr_).right_)->dx_).num_elts == 0)) {
      if (0 < (int)uVar3) {
        uVar13 = 0;
        do {
          vVar14 = FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>::dx
                             (&((fadexpr->fadexpr_).left_)->fadexpr_,(int)uVar13);
          pdVar12[uVar13] = vVar14 / (fadexpr->fadexpr_).right_.constant_;
          uVar13 = uVar13 + 1;
        } while (uVar3 != uVar13);
      }
    }
    else if (0 < (int)uVar3) {
      pdVar7 = *(double **)((long)&pFVar6->dx_ + 8);
      pFVar8 = (pFVar5->fadexpr_).right_;
      pdVar9 = (pFVar8->dx_).ptr_to_data;
      pFVar10 = (pFVar4->fadexpr_).right_;
      pdVar11 = (pFVar10->dx_).ptr_to_data;
      uVar13 = 0;
      do {
        dVar1 = pFVar8->val_;
        pdVar12[uVar13] =
             ((pdVar7[uVar13] * dVar1 + pdVar9[uVar13] * pFVar6->val_) * pFVar10->val_ +
             dVar1 * pFVar6->val_ * pdVar11[uVar13]) / (fadexpr->fadexpr_).right_.constant_;
        uVar13 = uVar13 + 1;
      } while (uVar3 != uVar13);
    }
  }
  pFVar4 = (fadexpr->fadexpr_).left_;
  pFVar5 = (pFVar4->fadexpr_).left_;
  this->val_ = (((pFVar5->fadexpr_).left_)->val_ * ((pFVar5->fadexpr_).right_)->val_ *
               ((pFVar4->fadexpr_).right_)->val_) / (fadexpr->fadexpr_).right_.constant_;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}